

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentityTokens.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Identity::IdentityTokens::readConfigurations_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,IdentityTokens *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Path local_70;
  Url local_50;
  
  client = *(Client **)this;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"config","");
  paVar1 = &local_70.value_.field_2;
  if (local_90 == &local_80) {
    local_70.value_.field_2._8_8_ = local_80._8_8_;
    local_70.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.value_._M_dataplus._M_p = (pointer)local_90;
  }
  local_70.value_.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_70.value_.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_70.value_._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = &local_80;
  getUrl(&local_50,this,&local_70);
  HttpConsumer::get(__return_storage_ptr__,client,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value_._M_dataplus._M_p != &local_50.value_.field_2) {
    operator_delete(local_50.value_._M_dataplus._M_p,
                    local_50.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Identity::IdentityTokens::readConfigurations() {
  return HttpConsumer::get(client_, getUrl(Path{"config"}));
}